

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O1

void duckdb_je_tsd_postfork_child(tsd_t *tsd)

{
  duckdb_je_malloc_mutex_postfork_child((tsdn_t *)tsd,&tsd_nominal_tsds_lock);
  tsd_nominal_tsds.qlh_first = (tsd_t *)0x0;
  if ((tsd->state).repr < 3) {
    tsd_add_nominal(tsd);
    return;
  }
  return;
}

Assistant:

void
tsd_postfork_child(tsd_t *tsd) {
	malloc_mutex_postfork_child(tsd_tsdn(tsd), &tsd_nominal_tsds_lock);
	ql_new(&tsd_nominal_tsds);

	if (tsd_state_get(tsd) <= tsd_state_nominal_max) {
		tsd_add_nominal(tsd);
	}
}